

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O0

bool __thiscall cs::token_id::dump(token_id *this,ostream *o)

{
  ostream *poVar1;
  string *psVar2;
  ostream *in_RSI;
  long in_RDI;
  
  poVar1 = std::operator<<(in_RSI,"< ID = \"");
  psVar2 = var_id::get_id_abi_cxx11_((var_id *)(in_RDI + 0x10));
  poVar1 = std::operator<<(poVar1,(string *)psVar2);
  std::operator<<(poVar1,"\" >");
  return true;
}

Assistant:

bool dump(std::ostream &o) const override
		{
			o << "< ID = \"" << mId.get_id() << "\" >";
			return true;
		}